

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O2

xmlNodeSetPtr xmlXPathDistinctSorted(xmlNodeSetPtr nodes)

{
  uint size;
  int iVar1;
  xmlNodeSetPtr cur;
  xmlHashTablePtr hash;
  xmlChar *key;
  void *pvVar2;
  ulong uVar3;
  ulong uVar4;
  xmlNodePtr cur_00;
  
  if (nodes == (xmlNodeSetPtr)0x0) {
    return (xmlNodeSetPtr)0x0;
  }
  if ((nodes->nodeNr != 0) && (nodes->nodeTab != (xmlNodePtr *)0x0)) {
    cur = (xmlNodeSetPtr)(*xmlMalloc)(0x10);
    uVar3 = 0;
    if (cur == (xmlNodeSetPtr)0x0) {
LAB_001afdf8:
      nodes = (xmlNodeSetPtr)0x0;
    }
    else {
      cur->nodeNr = 0;
      cur->nodeMax = 0;
      cur->nodeTab = (xmlNodePtr *)0x0;
      size = nodes->nodeNr;
      hash = xmlHashCreate(size);
      uVar4 = (ulong)size;
      if ((int)size < 1) {
        uVar4 = uVar3;
      }
      for (; uVar4 != uVar3; uVar3 = uVar3 + 1) {
        if ((long)uVar3 < (long)nodes->nodeNr) {
          cur_00 = nodes->nodeTab[uVar3];
        }
        else {
          cur_00 = (xmlNode *)0x0;
        }
        key = xmlNodeGetContent(cur_00);
        pvVar2 = xmlHashLookup(hash,key);
        if (pvVar2 == (void *)0x0) {
          iVar1 = xmlHashAddEntry(hash,key,key);
          if (iVar1 < 0) {
            (*xmlFree)(key);
          }
          else {
            iVar1 = xmlXPathNodeSetAddUnique(cur,cur_00);
            if (-1 < iVar1) goto LAB_001afdb2;
          }
          xmlHashFree(hash,xmlHashDefaultDeallocator);
          xmlXPathFreeNodeSet(cur);
          goto LAB_001afdf8;
        }
        (*xmlFree)(key);
LAB_001afdb2:
      }
      xmlHashFree(hash,xmlHashDefaultDeallocator);
      nodes = cur;
    }
  }
  return nodes;
}

Assistant:

xmlNodeSetPtr
xmlXPathDistinctSorted (xmlNodeSetPtr nodes) {
    xmlNodeSetPtr ret;
    xmlHashTablePtr hash;
    int i, l;
    xmlChar * strval;
    xmlNodePtr cur;

    if (xmlXPathNodeSetIsEmpty(nodes))
	return(nodes);

    ret = xmlXPathNodeSetCreate(NULL);
    if (ret == NULL)
        return(ret);
    l = xmlXPathNodeSetGetLength(nodes);
    hash = xmlHashCreate (l);
    for (i = 0; i < l; i++) {
	cur = xmlXPathNodeSetItem(nodes, i);
	strval = xmlXPathCastNodeToString(cur);
	if (xmlHashLookup(hash, strval) == NULL) {
	    if (xmlHashAddEntry(hash, strval, strval) < 0) {
                xmlFree(strval);
                goto error;
            }
	    if (xmlXPathNodeSetAddUnique(ret, cur) < 0)
	        goto error;
	} else {
	    xmlFree(strval);
	}
    }
    xmlHashFree(hash, xmlHashDefaultDeallocator);
    return(ret);

error:
    xmlHashFree(hash, xmlHashDefaultDeallocator);
    xmlXPathFreeNodeSet(ret);
    return(NULL);
}